

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O3

void ContinuousReadTest(BasePort *port,uchar boardNum)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  quadlet_t read_data;
  int local_54;
  long local_50;
  uint local_44;
  BasePort *local_40;
  ulong local_38;
  
  uVar3 = 1;
  uVar6 = 0;
  local_44 = (uint)boardNum;
  lVar5 = 0;
  lVar4 = 0;
  local_50 = 0;
  local_40 = port;
  do {
    local_54 = 0;
    iVar1 = (*local_40->_vptr_BasePort[0x23])(local_40,(ulong)local_44,4,&local_54);
    if ((char)iVar1 == '\0') {
      lVar4 = lVar4 + 1;
    }
    else if (local_54 == 0x514c4131) {
      local_50 = local_50 + 1;
    }
    else {
      lVar5 = lVar5 + 1;
    }
    bVar7 = 5 < (ulong)(lVar5 + lVar4);
    local_38 = uVar3;
    if ((uVar3 / 1000) * 1000 - 1 == uVar6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Success = ",10);
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", read failures = ",0x12);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", compare failures = ",0x15);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (0x270e < uVar6 || bVar7) {
        return;
      }
    }
    else if (0x270e < uVar6 || bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Success = ",10);
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", read failures = ",0x12);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", compare failures = ",0x15);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      return;
    }
    uVar3 = local_38 + 1;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void  ContinuousReadTest(BasePort *port, unsigned char boardNum)
{
    bool done = false;
    quadlet_t read_data;
    //char buf[5] = "QLA1";
    char buf[5] = "1ALQ";
    size_t success = 0;
    size_t readFailures = 0;
    size_t compareFailures = 0;
    unsigned long count = 0;
    while (!done) {
        count++;
        read_data = 0;
        if (!port->ReadQuadlet(boardNum, 4, read_data))
            readFailures++;
        else {
            if (memcmp((void *)&read_data, buf, 4) == 0)
                success++;
            else
                compareFailures++;
        }
        if (readFailures + compareFailures > 5) done = true;
        if (count >= 10000) done = true;

        // print status
        if (count % 1000 == 0) {
            std::cout << "Success = " << std::dec << success << ", read failures = " << readFailures << ", compare failures = "
                      << compareFailures << std::endl;
        }
    }
    if (count % 1000 != 0) {
        std::cout << "Success = " << std::dec << success << ", read failures = " << readFailures << ", compare failures = "
                  << compareFailures << std::endl;
    }
}